

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void pay_for_damage(char *dmgstr,boolean cant_mollify)

{
  char y;
  monst *pmVar1;
  char cVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  monst *pmVar10;
  long lVar11;
  uint uVar12;
  undefined7 in_register_00000031;
  long lVar13;
  damage *pdVar14;
  bool bVar15;
  char shops_affected [5];
  char qbuf [80];
  int local_cc;
  char *local_c8;
  uint local_bc;
  damage *local_b0;
  char local_a5;
  char local_a4 [4];
  monst *local_a0;
  undefined4 local_94;
  long local_90;
  char local_88 [88];
  
  cVar4 = u.ushops[0];
  local_94 = (undefined4)CONCAT71(in_register_00000031,cant_mollify);
  iVar5 = strcmp(dmgstr,"dig into");
  if (iVar5 == 0) {
    local_c8 = "shop";
  }
  else {
    iVar5 = strcmp(dmgstr,"damage");
    local_c8 = "door";
    if (iVar5 == 0) {
      local_c8 = "shop";
    }
  }
  pdVar14 = level->damagelist;
  if (pdVar14 == (damage *)0x0) {
    return;
  }
  uVar12 = 7000;
  uVar8 = 7000;
  local_a0 = (monst *)0x0;
  local_b0 = (damage *)0x0;
  local_cc = 0;
  local_bc = 7000;
  lVar13 = 0;
  do {
    if (pdVar14->when != (ulong)moves) break;
    if (pdVar14->cost != 0) {
      lVar13 = lVar13 + pdVar14->cost;
      pcVar9 = in_rooms(level,(pdVar14->place).x,(pdVar14->place).y,0x12);
      strcpy(&local_a5,pcVar9);
      if (local_a5 != '\0') {
        pcVar9 = local_a4;
        cVar2 = local_a5;
        local_90 = lVar13;
        do {
          pmVar10 = shop_keeper(level,cVar2);
          if (pmVar10 != (monst *)0x0) {
            if (pmVar10 == local_a0) {
              uVar6 = dist2((int)(pdVar14->place).x,(int)(pdVar14->place).y,(int)u.ux,(int)u.uy);
              bVar15 = uVar6 < uVar8;
              uVar8 = uVar12;
              if (bVar15) {
                uVar8 = uVar6;
                uVar12 = uVar6;
                local_b0 = pdVar14;
              }
            }
            else {
              iVar5 = inhishop(pmVar10);
              if (iVar5 != 0) {
                uVar6 = dist2((int)pmVar10->mx,(int)pmVar10->my,(int)u.ux,(int)u.uy);
                if (uVar6 <= local_bc) {
                  iVar5 = 1;
                  if (local_cc != 0 && uVar6 == local_bc) {
                    iVar5 = local_cc + 1;
                    uVar7 = mt_random();
                    local_cc = iVar5;
                    if (SUB168(ZEXT416(uVar7) % SEXT816((long)iVar5),0) != 0) goto LAB_00241e51;
                  }
                  uVar8 = dist2((int)(pdVar14->place).x,(int)(pdVar14->place).y,(int)u.ux,(int)u.uy)
                  ;
                  local_a0 = pmVar10;
                  uVar12 = uVar8;
                  local_cc = iVar5;
                  local_bc = uVar6;
                  local_b0 = pdVar14;
                }
              }
            }
          }
LAB_00241e51:
          cVar2 = *pcVar9;
          pcVar9 = pcVar9 + 1;
          lVar13 = local_90;
        } while (cVar2 != '\0');
      }
    }
    pdVar14 = pdVar14->next;
  } while (pdVar14 != (damage *)0x0);
  pmVar10 = local_a0;
  if (lVar13 == 0) {
    return;
  }
  if (local_a0 == (monst *)0x0) {
    return;
  }
  cVar2 = (local_b0->place).x;
  y = (local_b0->place).y;
  strncpy(&local_a0[0x1b].field_0x75,plname,0x20);
  if (((pmVar10->field_0x62 & 0x40) == 0) || (*(char *)((long)&pmVar10[0x1b].meating + 1) != '\0'))
  goto LAB_00242195;
  pcVar9 = in_rooms(level,pmVar10->mx,pmVar10->my,0x12);
  if (*pcVar9 == '\0') {
    if ((viz_array[pmVar10->my][pmVar10->mx] & 2U) == 0) {
      return;
    }
LAB_0024215f:
    pcVar9 = "How dare you %s my %s?";
  }
  else {
    if (cVar4 == '\0') {
      pmVar1 = level->monsters[cVar2][y];
      if (((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) && (flags.soundok != '\0'))
      {
        You_hear("an angry voice:");
        verbalize("Out of my way, scum!");
      }
      mnearto(pmVar10,cVar2,y,'\x01');
    }
    else {
      bVar3 = um_dist(pmVar10->mx,pmVar10->my,'\x01');
      if ((bVar3 != '\0') && (bVar3 = um_dist(pmVar10->mx,pmVar10->my,'\x03'), bVar3 == '\0')) {
        pline("%s leaps towards you!",(undefined1 *)((long)&pmVar10[0x1c].minvent + 5));
        mnexto(pmVar10);
      }
      bVar3 = um_dist(pmVar10->mx,pmVar10->my,'\x01');
      if (bVar3 != '\0') goto LAB_0024215f;
    }
    bVar3 = um_dist(cVar2,y,'\x01');
    if ((((char)local_94 == '\0') && (bVar3 == '\0' || cVar4 != '\0')) &&
       ((lVar11 = money_cnt(invent), lVar13 <= (int)pmVar10[0x1b].mappearance + lVar11 &&
        (uVar8 = mt_random(),
        0x51eb851 < (uVar8 * -0x3d70a3d7 >> 1 | (uint)((uVar8 * -0x3d70a3d7 & 1) != 0) << 0x1f)))))
    {
      if (((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
           (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
         (u.uprops[0xd].blocked == 0)) {
        pline("Your invisibility does not fool %s!",(undefined1 *)((long)&pmVar10[0x1c].minvent + 5)
             );
      }
      pcVar9 = currency(lVar13);
      sprintf(local_88,"\"Cad!  You did %ld %s worth of damage!\"  Pay? ",lVar13,pcVar9);
      cVar4 = yn_function(local_88,"yn",'n');
      if (cVar4 == 'n') {
        verbalize("Oh, yes!  You\'ll pay!");
        hot_pursuit(pmVar10);
        iVar5 = sgn((int)u.ualign.type);
        adjalign(-iVar5);
        return;
      }
      lVar13 = check_credit(lVar13,pmVar10);
      money2mon(pmVar10,lVar13);
      iflags.botl = '\x01';
      pline("Mollified, %s accepts your restitution.");
      home_shk(pmVar10,'\0');
      pacify_shk(pmVar10);
      return;
    }
    bVar3 = um_dist(cVar2,y,'\x01');
    if (bVar3 == '\0' || cVar4 != '\0') goto LAB_0024215f;
    pline("%s shouts:",(undefined1 *)((long)&pmVar10[0x1c].minvent + 5));
    pcVar9 = "Who dared %s my %s?";
  }
  verbalize(pcVar9,dmgstr,local_c8);
LAB_00242195:
  hot_pursuit(pmVar10);
  return;
}

Assistant:

void pay_for_damage(const char *dmgstr, boolean cant_mollify)
{
	struct monst *shkp = NULL;
	char shops_affected[5];
	boolean uinshp = (*u.ushops != '\0');
	char qbuf[80];
	xchar x, y;
	boolean dugwall = !strcmp(dmgstr, "dig into") ||	/* wand */
			  !strcmp(dmgstr, "damage");		/* pick-axe */
	struct damage *tmp_dam, *appear_here = 0;
	/* any number >= (80*80)+(24*24) would do, actually */
	long cost_of_damage = 0L;
	unsigned int nearest_shk = 7000, nearest_damage = 7000;
	int picks = 0;

	for (tmp_dam = level->damagelist;
	     (tmp_dam && (tmp_dam->when == moves));
	     tmp_dam = tmp_dam->next) {
	    char *shp;

	    if (!tmp_dam->cost)
		continue;
	    cost_of_damage += tmp_dam->cost;
	    strcpy(shops_affected,
		   in_rooms(level, tmp_dam->place.x, tmp_dam->place.y, SHOPBASE));
	    for (shp = shops_affected; *shp; shp++) {
		struct monst *tmp_shk;
		unsigned int shk_distance;

		if (!(tmp_shk = shop_keeper(level, *shp)))
		    continue;
		if (tmp_shk == shkp) {
		    unsigned int damage_distance =
				   distu(tmp_dam->place.x, tmp_dam->place.y);

		    if (damage_distance < nearest_damage) {
			nearest_damage = damage_distance;
			appear_here = tmp_dam;
		    }
		    continue;
		}
		if (!inhishop(tmp_shk))
		    continue;
		shk_distance = distu(tmp_shk->mx, tmp_shk->my);
		if (shk_distance > nearest_shk)
		    continue;
		if ((shk_distance == nearest_shk) && picks) {
		    if (rn2(++picks))
			continue;
		} else
		    picks = 1;
		shkp = tmp_shk;
		nearest_shk = shk_distance;
		appear_here = tmp_dam;
		nearest_damage = distu(tmp_dam->place.x, tmp_dam->place.y);
	    }
	}

	if (!cost_of_damage || !shkp)
	    return;

	x = appear_here->place.x;
	y = appear_here->place.y;

	/* not the best introduction to the shk... */
	strncpy(ESHK(shkp)->customer,plname,PL_NSIZ);

	/* if the shk is already on the war path, be sure it's all out */
	if (ANGRY(shkp) || ESHK(shkp)->following) {
		hot_pursuit(shkp);
		return;
	}

	/* if the shk is not in their shop.. */
	if (!*in_rooms(level, shkp->mx,shkp->my,SHOPBASE)) {
		if (!cansee(shkp->mx, shkp->my))
			return;
		goto getcad;
	}

	if (uinshp) {
		if (um_dist(shkp->mx, shkp->my, 1) &&
			!um_dist(shkp->mx, shkp->my, 3)) {
		    pline("%s leaps towards you!", shkname(shkp));
		    mnexto(shkp);
		}
		if (um_dist(shkp->mx, shkp->my, 1)) goto getcad;
	} else {
	    /*
	     * Make shkp show up at the door.  Effect:  If there is a monster
	     * in the doorway, have the hero hear the shopkeeper yell a bit,
	     * pause, then have the shopkeeper appear at the door, having
	     * yanked the hapless critter out of the way.
	     */
	    if (MON_AT(level, x, y)) {
		if (flags.soundok) {
		    You_hear("an angry voice:");
		    verbalize("Out of my way, scum!");
		}
	    }
	    mnearto(shkp, x, y, TRUE);
	}

	if ((um_dist(x, y, 1) && !uinshp) || cant_mollify ||
	   (money_cnt(invent) + ESHK(shkp)->credit) < cost_of_damage || !rn2(50)) {
		if (um_dist(x, y, 1) && !uinshp) {
		    pline("%s shouts:", shkname(shkp));
		    verbalize("Who dared %s my %s?", dmgstr,
					 dugwall ? "shop" : "door");
		} else {
getcad:
		    verbalize("How dare you %s my %s?", dmgstr,
					 dugwall ? "shop" : "door");
		}
		hot_pursuit(shkp);
		return;
	}

	if (Invis) pline("Your invisibility does not fool %s!", shkname(shkp));
	sprintf(qbuf,"\"Cad!  You did %ld %s worth of damage!\"  Pay? ",
		 cost_of_damage, currency(cost_of_damage));
	if (yn(qbuf) != 'n') {
		cost_of_damage = check_credit(cost_of_damage, shkp);
                money2mon(shkp, cost_of_damage);
		iflags.botl = 1;
		pline("Mollified, %s accepts your restitution.",
			shkname(shkp));
		/* move shk back to his home loc */
		home_shk(shkp, FALSE);
		pacify_shk(shkp);
	} else {
		verbalize("Oh, yes!  You'll pay!");
		hot_pursuit(shkp);
		adjalign(-sgn(u.ualign.type));
	}
}